

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::java::FileJavaPackage_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FileDescriptor *file)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((*(byte *)(*(long *)(this + 0x88) + 0x80) & 1) == 0) {
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x2313f7);
    if (*(long *)(*(long *)(this + 8) + 8) != 0) {
      if (__return_storage_ptr__->_M_string_length != 0) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,**(ulong **)(this + 8));
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string FileJavaPackage(const FileDescriptor* file) {
  string result;

  if (file->options().has_java_package()) {
    result = file->options().java_package();
  } else {
    result = kDefaultPackage;
    if (!file->package().empty()) {
      if (!result.empty()) result += '.';
      result += file->package();
    }
  }


  return result;
}